

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O2

void Abc_GenSorter(char *pFileName,int nVars)

{
  FILE *__stream;
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (1 < nVars) {
    __stream = fopen(pFileName,"w");
    pcVar1 = Extra_TimeStamp();
    fprintf(__stream,"# %d-bit sorter generated by ABC on %s\n",(ulong)(uint)nVars,pcVar1);
    fprintf(__stream,".model Sorter%02d\n",(ulong)(uint)nVars);
    fwrite(".inputs",7,1,__stream);
    for (uVar4 = 0; nVars != uVar4; uVar4 = uVar4 + 1) {
      fprintf(__stream," x%02d",(ulong)uVar4);
    }
    fputc(10,__stream);
    fwrite(".outputs",8,1,__stream);
    for (uVar4 = 0; nVars != uVar4; uVar4 = uVar4 + 1) {
      fprintf(__stream," y%02d",(ulong)uVar4);
    }
    fputc(10,__stream);
    uVar4 = Abc_Base10Log((nVars + -2) * nVars);
    if (nVars == 2) {
      fwrite(".subckt Comp a=x00 b=x01 x=y00 y=y01\n",0x25,1,__stream);
    }
    else {
      fwrite(".subckt Layer0",0xe,1,__stream);
      for (uVar5 = 0; nVars != uVar5; uVar5 = uVar5 + 1) {
        fprintf(__stream," x%02d=x%02d",(ulong)uVar5,(ulong)uVar5);
      }
      for (uVar2 = 0; nVars != (int)uVar2; uVar2 = (ulong)((int)uVar2 + 1)) {
        fprintf(__stream," y%02d=%0*d",uVar2,(ulong)uVar4,uVar2);
      }
      fputc(10,__stream);
      uVar5 = 1;
      uVar3 = nVars;
      while( true ) {
        fprintf(__stream,".subckt Layer%d",(ulong)(uVar5 & 1));
        if (nVars * 2 + -2 <= (int)uVar5) break;
        for (uVar6 = 0; nVars != uVar6; uVar6 = uVar6 + 1) {
          fprintf(__stream," x%02d=%0*d",(ulong)uVar6,(ulong)uVar4,(ulong)(uVar6 + (uVar3 - nVars)))
          ;
        }
        uVar6 = 0;
        while( true ) {
          if (nVars == uVar6) break;
          fprintf(__stream," y%02d=%0*d",(ulong)uVar6,(ulong)uVar4,(ulong)(uVar3 + uVar6));
          uVar6 = uVar6 + 1;
        }
        fputc(10,__stream);
        uVar5 = uVar5 + 1;
        uVar3 = uVar3 + uVar6;
      }
      for (uVar5 = 0; nVars != uVar5; uVar5 = uVar5 + 1) {
        fprintf(__stream," x%02d=%0*d",(ulong)uVar5,(ulong)uVar4,(ulong)(uVar5 + (uVar3 - nVars)));
      }
      for (uVar4 = 0; nVars != uVar4; uVar4 = uVar4 + 1) {
        fprintf(__stream," y%02d=y%02d",(ulong)uVar4,(ulong)uVar4);
      }
      fputc(10,__stream);
    }
    fwrite(".end\n",5,1,__stream);
    fputc(10,__stream);
    Abc_WriteLayer((FILE *)__stream,nVars,0);
    Abc_WriteLayer((FILE *)__stream,nVars,1);
    Abc_WriteComp((FILE *)__stream);
    fclose(__stream);
    return;
  }
  __assert_fail("nVars > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                ,0x108,"void Abc_GenSorter(char *, int)");
}

Assistant:

void Abc_GenSorter( char * pFileName, int nVars )
{
    FILE * pFile;
    int i, k, Counter, nDigits;

    assert( nVars > 1 );

    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# %d-bit sorter generated by ABC on %s\n", nVars, Extra_TimeStamp() );
    fprintf( pFile, ".model Sorter%02d\n", nVars );

    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " x%02d", i );
    fprintf( pFile, "\n" );

    fprintf( pFile, ".outputs" );
    for ( i = 0; i < nVars; i++ )
        fprintf( pFile, " y%02d", i );
    fprintf( pFile, "\n" );

    Counter = 0;
    nDigits = Abc_Base10Log( (nVars-2)*nVars );
    if ( nVars == 2 )
        fprintf( pFile, ".subckt Comp a=x00 b=x01 x=y00 y=y01\n" );
    else
    {
        fprintf( pFile, ".subckt Layer0" );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=x%02d", k, k );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
        fprintf( pFile, "\n" );
        Counter -= nVars;
        for ( i = 1; i < 2*nVars-2; i++ )
        {
            fprintf( pFile, ".subckt Layer%d", (i&1) );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
            for ( k = 0; k < nVars; k++ )
                fprintf( pFile, " y%02d=%0*d", k, nDigits, Counter++ );
            fprintf( pFile, "\n" );
            Counter -= nVars;
        }
        fprintf( pFile, ".subckt Layer%d", (i&1) );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " x%02d=%0*d", k, nDigits, Counter++ );
        for ( k = 0; k < nVars; k++ )
            fprintf( pFile, " y%02d=y%02d", k, k );
        fprintf( pFile, "\n" );
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" );

    Abc_WriteLayer( pFile, nVars, 0 );
    Abc_WriteLayer( pFile, nVars, 1 );
    Abc_WriteComp( pFile );
    fclose( pFile );
}